

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::ReadBytes(CodedInputStream *input,string *value)

{
  bool bVar1;
  bool local_31;
  string *value_local;
  CodedInputStream *input_local;
  string *psStack_18;
  uint32 length;
  CodedInputStream *local_10;
  
  psStack_18 = value;
  local_10 = input;
  bVar1 = io::CodedInputStream::ReadVarint32(input,(uint32 *)((long)&input_local + 4));
  local_31 = false;
  if (bVar1) {
    local_31 = io::CodedInputStream::ReadString(local_10,psStack_18,input_local._4_4_);
  }
  return local_31;
}

Assistant:

bool WireFormatLite::ReadBytes(io::CodedInputStream* input,
                               std::string* value) {
  return ReadBytesToString(input, value);
}